

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

prsndef * prsfold(prscxdef *ctx,prsndef *node)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  prsndef *ppVar8;
  int *piVar9;
  prsndef *ppVar10;
  ulong uVar11;
  uint siz;
  byte bVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  tokdef t;
  
  if (node->prsntyp == 0x3b) {
    bVar15 = true;
    siz = 8;
    iVar13 = 0;
    for (ppVar10 = node; ppVar10 != (prsndef *)0x0; ppVar10 = (ppVar10->prsnv).prsnvn[1]) {
      ppVar8 = prsfold(ctx,(ppVar10->prsnv).prsnvn[0]);
      (ppVar10->prsnv).prsnvn[0] = ppVar8;
      bVar6 = false;
      if (ppVar8->prsnnlf == 0) {
        iVar2 = (ppVar8->prsnv).prsnvt.toktyp;
        uVar7 = iVar2 - 0x36;
        if ((0x1f < uVar7) || ((0x81c00007U >> (uVar7 & 0x1f) & 1) == 0)) {
          bVar15 = false;
        }
        bVar6 = bVar15;
        if (iVar2 == 0x38) {
          if (((ppVar8->prsnv).prsnvt.toksym.tokstyp & 0xfe) == 4) {
            bVar15 = false;
          }
          prsdef(ctx,&(ppVar8->prsnv).prsnvt,7);
          bVar6 = bVar15;
        }
      }
      bVar15 = bVar6;
      iVar13 = iVar13 + 1;
      siz = siz + 0x10;
    }
    if (!bVar15) {
      return node;
    }
    piVar9 = (int *)prsbalo(ctx,siz);
    t.toktyp = 0x4c;
    t.tokofs = ((short)piVar9 - (short)ctx) - 0xd0;
    ppVar10 = prsnew0(ctx,&t);
    *piVar9 = iVar13;
    piVar9 = piVar9 + 2;
    do {
      if (node == (prsndef *)0x0) {
        return ppVar10;
      }
      ppVar8 = (node->prsnv).prsnvn[0];
      uVar1 = *(uchar *)&ppVar8->prsnv;
      *(uchar *)piVar9 = uVar1;
      if (uVar1 == '6') {
LAB_0011daf8:
        uVar11 = (ulong)(ppVar8->prsnv).prsnvt.tokofs;
      }
      else if (uVar1 == '8') {
        bVar12 = (ppVar8->prsnv).prsnvt.toksym.tokstyp - 1;
        if ((0xd < bVar12) || ((0x20c7U >> (bVar12 & 0x1f) & 1) == 0)) {
          errsigf(ctx->prscxerr,"TADS",0x193);
        }
        *(undefined *)piVar9 = (&DAT_00137366)[bVar12];
        uVar11 = (ulong)*(ushort *)((long)&ppVar8->prsnv + 0x42);
      }
      else {
        if ((uVar1 == 'U') || (uVar1 == 'L')) goto LAB_0011daf8;
        uVar11 = (ppVar8->prsnv).prsnvt.tokval;
      }
      *(ulong *)(piVar9 + 2) = uVar11;
      node = (node->prsnv).prsnvn[1];
      piVar9 = piVar9 + 4;
    } while( true );
  }
  bVar15 = true;
  iVar13 = node->prsnnlf;
  for (lVar14 = 0; iVar13 != (int)lVar14; lVar14 = lVar14 + 1) {
    ppVar10 = prsfold(ctx,*(prsndef **)((long)&node->prsnv + lVar14 * 8));
    *(prsndef **)((long)&node->prsnv + lVar14 * 8) = ppVar10;
    if (((ppVar10->prsnnlf != 0) || (uVar7 = (ppVar10->prsnv).prsnvt.toktyp - 0x36, 0x1f < uVar7))
       || ((0x81c00003U >> (uVar7 & 0x1f) & 1) == 0)) {
      bVar15 = false;
    }
  }
  iVar13 = node->prsnnlf;
  if (!bVar15 || iVar13 == 0) {
    return node;
  }
  if (iVar13 == 1) {
    iVar13 = node->prsntyp;
    if (iVar13 != 2) {
      ppVar10 = (node->prsnv).prsnvn[0];
      iVar2 = (ppVar10->prsnv).prsnvt.toktyp;
      uVar11 = (ppVar10->prsnv).prsnvt.tokval;
      if (iVar13 == 3) {
        if (iVar2 != 0x37) goto LAB_0011de34;
        uVar11 = -uVar11;
      }
      else {
        if (iVar13 == 6) {
          if (iVar2 - 0x4dU < 2) {
            bVar15 = iVar2 == 0x4d;
          }
          else {
            if (iVar2 != 0x37) goto LAB_0011de34;
            bVar15 = uVar11 == 0;
          }
          (ppVar10->prsnv).prsnvt.toktyp = bVar15 + 0x4d;
          goto LAB_0011de17;
        }
        if (iVar13 != 0x1e) {
          return node;
        }
        if (iVar2 != 0x37) goto LAB_0011de34;
        uVar11 = ~uVar11;
      }
      (ppVar10->prsnv).prsnvt.tokval = uVar11;
    }
    goto LAB_0011de17;
  }
  if (iVar13 != 2) {
    if (iVar13 != 3) {
      return node;
    }
    iVar13 = ((node->prsnv).prsnvn[0]->prsnv).prsnvt.toktyp;
    if (iVar13 == 0x37) {
      if (((node->prsnv).prsnvn[0]->prsnv).prsnvt.tokval == 0) goto LAB_0011dc81;
    }
    else {
      if (iVar13 == 0x4d) {
LAB_0011dc81:
        return (node->prsnv).prsnvn[2];
      }
      if (iVar13 != 0x4e) goto LAB_0011de34;
    }
    return (prsndef *)(node->prsnv).prsnvt.tokval;
  }
  ppVar10 = (node->prsnv).prsnvn[0];
  uVar11 = (ppVar10->prsnv).prsnvt.tokval;
  uVar4 = ((node->prsnv).prsnvn[1]->prsnv).prsnvt.tokval;
  iVar13 = (ppVar10->prsnv).prsnvt.toktyp;
  iVar2 = ((node->prsnv).prsnvn[1]->prsnv).prsnvt.toktyp;
  iVar3 = node->prsntyp;
  switch(iVar3 + -2) {
  case 0:
  case 1:
    break;
  case 2:
  case 3:
  case 0xb:
  case 0xf:
  case 0x10:
    goto switchD_0011dbc8_caseD_2;
  case 4:
  case 0xc:
  case 0xd:
    goto LAB_0011dd45;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    goto switchD_0011dbc8_caseD_5;
  case 0xe:
    goto switchD_0011dbc8_caseD_e;
  default:
    if (1 < iVar3 - 0x41U) {
      return node;
    }
    if (((0x17 < iVar13 - 0x37U) || ((0xc00001U >> (iVar13 - 0x37U & 0x1f) & 1) == 0)) ||
       ((0x17 < iVar2 - 0x37U || ((0xc00001U >> (iVar2 - 0x37U & 0x1f) & 1) == 0))))
    goto LAB_0011de34;
    iVar5 = 0x4e - (uint)(uVar11 == 0);
    if (iVar13 != 0x37) {
      iVar5 = iVar13;
    }
    iVar13 = 0x4e - (uint)(uVar4 == 0);
    if (iVar2 != 0x37) {
      iVar13 = iVar2;
    }
    if (iVar3 == 0x42) {
      bVar15 = iVar5 == 0x4e && iVar13 == 0x4e;
    }
    else {
      bVar15 = iVar5 == 0x4e || iVar13 == 0x4e;
    }
    goto LAB_0011dd83;
  }
  if (iVar2 == 0x4c) {
    return node;
  }
  if (iVar13 == 0x36) {
    return node;
  }
  if (iVar13 == 0x4c) {
    return node;
  }
switchD_0011dbc8_caseD_5:
  if ((iVar13 != 0x37) || (iVar2 != 0x37)) {
LAB_0011dd45:
    return node;
  }
switchD_0011dbc8_caseD_e:
  if ((iVar2 - 0x4dU | iVar13 - 0x4dU) < 2) {
    bVar15 = (iVar2 == 0x4e) != (iVar13 == 0x4e);
LAB_0011dd83:
    (ppVar10->prsnv).prsnvt.toktyp = bVar15 + 0x4d;
    goto LAB_0011de17;
  }
switchD_0011dbc8_caseD_2:
  if ((iVar13 != 0x37) || (iVar2 != 0x37)) {
LAB_0011de34:
    errsigf(ctx->prscxerr,"TADS",0x143);
  }
  switch(iVar3 + -2) {
  case 0:
    uVar11 = uVar11 + uVar4;
    break;
  case 1:
    uVar11 = uVar11 - uVar4;
    break;
  case 2:
    if (uVar4 == 0) {
LAB_0011de48:
      errsigf(ctx->prscxerr,"TADS",0x414);
    }
    uVar11 = (long)uVar11 / (long)uVar4;
    break;
  case 3:
    uVar11 = uVar11 * uVar4;
    break;
  default:
    goto LAB_0011dd45;
  case 5:
    uVar7 = (uint)(uVar11 == uVar4);
    goto LAB_0011de0d;
  case 6:
    uVar7 = (uint)(uVar11 != uVar4);
    goto LAB_0011de0d;
  case 7:
    uVar7 = (uint)((long)uVar4 < (long)uVar11);
    goto LAB_0011de0d;
  case 8:
    uVar7 = (uint)((long)uVar4 <= (long)uVar11);
    goto LAB_0011de0d;
  case 9:
    uVar7 = (uint)((long)uVar11 < (long)uVar4);
    goto LAB_0011de0d;
  case 10:
    uVar7 = (uint)((long)uVar11 <= (long)uVar4);
LAB_0011de0d:
    iVar13 = uVar7 + 0x4d;
    goto LAB_0011de10;
  case 0xb:
    if (uVar4 == 0) goto LAB_0011de48;
    uVar11 = (long)uVar11 % (long)uVar4;
    iVar13 = 0x37;
    goto LAB_0011de10;
  case 0xe:
    uVar11 = uVar11 ^ uVar4;
    break;
  case 0xf:
    uVar11 = uVar11 << ((byte)uVar4 & 0x3f);
    break;
  case 0x10:
    uVar11 = (long)uVar11 >> ((byte)uVar4 & 0x3f);
  }
  iVar13 = 0x37;
LAB_0011de10:
  (ppVar10->prsnv).prsnvt.toktyp = iVar13;
  (ppVar10->prsnv).prsnvt.tokval = uVar11;
LAB_0011de17:
  return (node->prsnv).prsnvn[0];
}

Assistant:

static prsndef *prsfold(prscxdef *ctx, prsndef *node)
{
    int       i;
    prsndef **n;
    int       can_fold;
    int       typ;
    tokdef   *tok1, *tok2;
    int       typ1, typ2;
    long      val1, val2;
    prsndef  *ncur;
    
    can_fold = TRUE;                       /* assume we can do some folding */

    /* if this is a list-construction node, special handling is needed */
    if (node->prsntyp == TOKTRBRACK)
    {
        for (i=0, ncur = node ; ncur ; ++i, ncur = ncur->prsnv.prsnvn[1])
        {
            ncur->prsnv.prsnvn[0] = prsfold(ctx, ncur->prsnv.prsnvn[0]);
            typ = TOKTINVALID;
            if (ncur->prsnv.prsnvn[0]->prsnnlf != 0 ||
                ((typ = ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toktyp)
                 != TOKTNUMBER && typ != TOKTSSTRING && typ != TOKTLIST
                 && typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND
                 && typ != TOKTSYMBOL))
                can_fold = FALSE;              /* not constant - can't fold */
            
            if (typ == TOKTSYMBOL
                && (ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTLOCAL
                    || ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTSELF))
                can_fold = FALSE;
            
            if (ncur->prsnv.prsnvn[0]->prsnnlf == 0 && typ == TOKTSYMBOL)
                prsdef(ctx, &ncur->prsnv.prsnvn[0]->prsnv.prsnvt,
                       TOKSTFWDOBJ);
        }
        if (can_fold)
        {
            tokdef    t;
            emtlidef *lst;
            prsndef  *retval;
            emtledef *ele;
            
            lst = (emtlidef *)prsbalo(ctx, (uint)(sizeof(emtlidef) +
                                                 (i - 1) * sizeof(emtledef)));
            t.toktyp = TOKTLIST;
            t.tokofs = ((uchar *)lst) - &ctx->prscxpool[0];
            retval = prsnew0(ctx, &t);
            
            lst->emtlicnt = i;
            
            for (ele = &lst->emtliele[0] ; node ;
                   node = node->prsnv.prsnvn[1], ++ele)
            {
                ncur = node->prsnv.prsnvn[0];
                switch(ele->emtletyp = ncur->prsnv.prsnvt.toktyp)
                {
                case TOKTLIST:
                case TOKTSSTRING:
                case TOKTPOUND:
                    ele->emtleval = ncur->prsnv.prsnvt.tokofs;
                    break;
                    
                case TOKTSYMBOL:
                    switch(ncur->prsnv.prsnvt.toksym.tokstyp)
                    {
                    case TOKSTFUNC:
                    case TOKSTFWDFN:
                        ele->emtletyp = TOKTFUNCTION;
                        break;
                    case TOKSTOBJ:
                    case TOKSTFWDOBJ:
                        ele->emtletyp = TOKTOBJECT;
                        break;
                    case TOKSTPROP:
                        ele->emtletyp = TOKTDOT;
                        break;
                    case TOKSTPROPSPEC:
                        ele->emtletyp = TOKTDOT;
                        break;
                    default:
                        errsig(ctx->prscxerr, ERR_INVLSTE);
                    }
                    ele->emtleval = ncur->prsnv.prsnvt.toksym.toksval;
                    break;
                    
                default:
                    ele->emtleval = ncur->prsnv.prsnvt.tokval;
                    break;
                }
            }

            node = retval;
        }
        return(node);
    }
    
    /*
     *   If we have sub-nodes, try to fold them.  If they fold down to
     *   leaf nodes, we can try to apply the expression to them. 
     */
    for (i = node->prsnnlf, n = &node->prsnv.prsnvn[0] ; i ; ++n, --i)
    {
        *n = prsfold(ctx, *n);
        if ((*n)->prsnnlf != 0 ||
            ((typ = (*n)->prsnv.prsnvt.toktyp) != TOKTNUMBER &&
             typ != TOKTSSTRING && typ != TOKTLIST &&
             typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND))
            can_fold = FALSE;                  /* not constant - can't fold */
    }

    /* if at a leaf, or subnodes are non-constant, can't fold anything */
    if (node->prsnnlf == 0 || !can_fold) return(node);

    switch(node->prsnnlf)
    {
    case 1:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        typ1 = tok1->toktyp;
        val1 = tok1->tokval;
        
        switch(node->prsntyp)
        {
        case TOKTPLUS:
            break;
            
        case TOKTMINUS:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = -val1;
            break;
            
        case TOKTNOT:
            if (!prsvlog(typ1))
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->toktyp = (prs2log(typ1, val1) == TOKTNIL ?
                            TOKTTRUE : TOKTNIL);
            break;

        case TOKTTILDE:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = ~val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 2:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        tok2 = &node->prsnv.prsnvn[1]->prsnv.prsnvt;
        val1 = tok1->tokval;
        val2 = tok2->tokval;
        typ1 = tok1->toktyp;
        typ2 = tok2->toktyp;
        
        switch(node->prsntyp)
        {
        case TOKTOR:
        case TOKTAND:
            if (!prsvlog(typ1) || !prsvlog(typ2))
                errsig(ctx->prscxerr, ERR_INVOP);
            typ1 = (prs2log(typ1, val1) == TOKTTRUE);
            typ2 = (prs2log(typ2, val2) == TOKTTRUE);

            if (node->prsntyp == TOKTAND) typ1 = typ1 && typ2;
            else                          typ1 = typ1 || typ2;

            tok1->toktyp = (typ1 ? TOKTTRUE : TOKTNIL);
            break;

        case TOKTPLUS:
        case TOKTMINUS:
            if (typ1 == TOKTSSTRING || typ1 == TOKTLIST || typ2 == TOKTLIST)
                return(node);
            /* FALLTHROUGH */
            
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                return(node);
            /* FALLTHROUGH */

        case TOKTXOR:
            if ((typ1 == TOKTTRUE || typ1 == TOKTNIL)
                && (typ2 == TOKTTRUE || typ2 == TOKTNIL))
            {
                int a, b;

                a = (typ1 == TOKTTRUE ? 1 : 0);
                b = (typ2 == TOKTTRUE ? 1 : 0);
                tok1->toktyp = ((a ^ b) ? TOKTTRUE : TOKTNIL);
                break;
            }
            /* FALLTHROUGH */

        case TOKTDIV:
        case TOKTTIMES:
        case TOKTMOD:
        case TOKTSHL:
        case TOKTSHR:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            switch(node->prsntyp)
            {
            case TOKTPLUS:
                val1 += val2;
                break;
            case TOKTMINUS:
                val1 -= val2;
                break;
            case TOKTTIMES:
                val1 *= val2;
                break;
            case TOKTDIV:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 /= val2;
                break;
            case TOKTMOD:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 %= val2;
                break;
            case TOKTXOR:
                val1 ^= val2;
                break;
            case TOKTSHL:
                val1 <<= val2;
                break;
            case TOKTSHR:
                val1 >>= val2;
                break;
            case TOKTEQ:
                typ1 = (val1 == val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTNE:
                typ1 = (val1 != val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGT:
                typ1 = (val1 > val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLT:
                typ1 = (val1 < val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLE:
                typ1 = (val1 <= val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGE:
                typ1 = (val1 >= val2 ? TOKTTRUE : TOKTNIL);
                break;
                
            default:
                return(node);
            }
            tok1->toktyp = typ1;
            tok1->tokval = val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 3:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        if (!prsvlog(tok1->toktyp)) errsig(ctx->prscxerr, ERR_INVOP);
        if (prs2log(tok1->toktyp, tok1->tokval) == TOKTTRUE)
            return(node->prsnv.prsnvn[1]);
        else
            return(node->prsnv.prsnvn[2]);
        
    default:
        return(node);
    }

    /* return the first sub-node, which has the folded value */
    return(node->prsnv.prsnvn[0]);
}